

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_nbget_ghost_dir(Integer g_a,Integer *mask,Integer *nbhandle)

{
  short sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_RSI;
  long in_RDI;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d;
  Integer me;
  char *ptr_loc;
  Integer width;
  Integer dim;
  Integer ndim;
  Integer i;
  Integer ld [7];
  Integer subscript [7];
  Integer hi_rem [7];
  Integer lo_rem [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer handle;
  int local_34c;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  Integer *in_stack_fffffffffffffcd0;
  Integer *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  int local_318;
  int local_314;
  int local_30c;
  int local_308 [10];
  int local_2e0;
  int local_2dc;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268 [8];
  long local_228 [8];
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  Integer local_1c8;
  char *local_1c0;
  Integer in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  long local_1a0;
  long local_198 [8];
  long alStack_158 [8];
  long local_118 [8];
  long local_d8 [8];
  long local_98 [8];
  long local_58 [2];
  Integer *in_stack_ffffffffffffffb8;
  Integer *in_stack_ffffffffffffffc0;
  Integer in_stack_ffffffffffffffc8;
  Integer in_stack_ffffffffffffffd0;
  
  lVar3 = in_RDI + 1000;
  local_1c8 = pnga_nodeid();
  lVar4 = (long)GA[lVar3].ndim;
  for (local_1a0 = 0; local_1a0 < lVar4; local_1a0 = local_1a0 + 1) {
    lVar5 = *(long *)(in_RSI + local_1a0 * 8);
    if (lVar5 < 1) {
      lVar5 = -lVar5;
    }
    if (lVar5 != 0) {
      lVar5 = *(long *)(in_RSI + local_1a0 * 8);
      if (lVar5 < 1) {
        lVar5 = -lVar5;
      }
      if (lVar5 != 1) {
        pnga_error(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
    }
  }
  pnga_distribution(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
  for (local_1a0 = 0; local_1a0 < lVar4; local_1a0 = local_1a0 + 1) {
    lVar5 = GA[lVar3].dims[local_1a0];
    lVar2 = GA[lVar3].width[local_1a0];
    if (*(long *)(in_RSI + local_1a0 * 8) == 1) {
      if (local_98[local_1a0] == lVar5) {
        local_d8[local_1a0] = 1;
        local_118[local_1a0] = lVar2;
      }
      else {
        local_d8[local_1a0] = local_98[local_1a0] + 1;
        local_118[local_1a0] = local_98[local_1a0] + lVar2;
      }
    }
    else if (*(long *)(in_RSI + local_1a0 * 8) == -1) {
      if (local_58[local_1a0] == 1) {
        local_d8[local_1a0] = (lVar5 - lVar2) + 1;
        local_118[local_1a0] = lVar5;
      }
      else {
        local_d8[local_1a0] = local_58[local_1a0] - lVar2;
        local_118[local_1a0] = local_58[local_1a0] + -1;
      }
    }
    else {
      local_d8[local_1a0] = local_58[local_1a0];
      local_118[local_1a0] = local_98[local_1a0];
    }
  }
  for (local_1a0 = 0; local_1a0 < lVar4; local_1a0 = local_1a0 + 1) {
    if (*(long *)(in_RSI + local_1a0 * 8) == 1) {
      alStack_158[local_1a0] =
           (local_98[local_1a0] - local_58[local_1a0]) + 1 + GA[lVar3].width[local_1a0];
    }
    else if (*(long *)(in_RSI + local_1a0 * 8) == -1) {
      alStack_158[local_1a0] = 0;
    }
    else {
      alStack_158[local_1a0] = GA[lVar3].width[local_1a0];
    }
    local_198[local_1a0] =
         (local_98[local_1a0] - local_58[local_1a0]) + 1 + GA[lVar3].width[local_1a0] * 2;
  }
  local_1d8 = 1;
  local_1e0 = (long)(GA[lVar3].ndim + -1);
  local_1e8 = 0;
  if (GA[lVar3].distr_type == 0) {
    if (GA[lVar3].num_rstrctd == 0) {
      local_290 = (long)GA[lVar3].ndim;
      local_298 = 0;
      local_278 = 1;
      for (local_280 = 0; local_280 < local_290; local_280 = local_280 + 1) {
        local_278 = GA[lVar3].nblock[local_280] * local_278;
      }
      if ((local_278 + -1 < local_1c8) || (local_1c8 < 0)) {
        for (local_280 = 0; local_280 < local_290; local_280 = local_280 + 1) {
          local_228[local_280] = 0;
          local_268[local_280] = -1;
        }
      }
      else {
        local_288 = local_1c8;
        for (local_280 = 0; local_280 < local_290; local_280 = local_280 + 1) {
          local_270 = local_288 % (long)GA[lVar3].nblock[local_280];
          local_288 = local_288 / (long)GA[lVar3].nblock[local_280];
          local_2a0 = local_270 + local_298;
          local_298 = GA[lVar3].nblock[local_280] + local_298;
          local_228[local_280] = GA[lVar3].mapc[local_2a0];
          if (local_270 == GA[lVar3].nblock[local_280] + -1) {
            local_268[local_280] = GA[lVar3].dims[local_280];
          }
          else {
            local_268[local_280] = GA[lVar3].mapc[local_2a0 + 1] + -1;
          }
        }
      }
    }
    else if (local_1c8 < GA[lVar3].num_rstrctd) {
      local_2c8 = (long)GA[lVar3].ndim;
      local_2d0 = 0;
      local_2b0 = 1;
      for (local_2b8 = 0; local_2b8 < local_2c8; local_2b8 = local_2b8 + 1) {
        local_2b0 = GA[lVar3].nblock[local_2b8] * local_2b0;
      }
      if ((local_2b0 + -1 < local_1c8) || (local_1c8 < 0)) {
        for (local_2b8 = 0; local_2b8 < local_2c8; local_2b8 = local_2b8 + 1) {
          local_228[local_2b8] = 0;
          local_268[local_2b8] = -1;
        }
      }
      else {
        local_2c0 = local_1c8;
        for (local_2b8 = 0; local_2b8 < local_2c8; local_2b8 = local_2b8 + 1) {
          local_2a8 = local_2c0 % (long)GA[lVar3].nblock[local_2b8];
          local_2c0 = local_2c0 / (long)GA[lVar3].nblock[local_2b8];
          local_2d8 = local_2a8 + local_2d0;
          local_2d0 = GA[lVar3].nblock[local_2b8] + local_2d0;
          local_228[local_2b8] = GA[lVar3].mapc[local_2d8];
          if (local_2a8 == GA[lVar3].nblock[local_2b8] + -1) {
            local_268[local_2b8] = GA[lVar3].dims[local_2b8];
          }
          else {
            local_268[local_2b8] = GA[lVar3].mapc[local_2d8 + 1] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[lVar3].ndim;
      local_2e0 = (int)sVar1;
      for (local_2dc = 0; local_2dc < sVar1; local_2dc = local_2dc + 1) {
        local_228[local_2dc] = 0;
        local_268[local_2dc] = -1;
      }
    }
  }
  else {
    local_314 = (int)local_1c8;
    if (((GA[lVar3].distr_type == 1) || (GA[lVar3].distr_type == 2)) || (GA[lVar3].distr_type == 3))
    {
      sVar1 = GA[lVar3].ndim;
      in_stack_fffffffffffffce4 = (int)GA[lVar3].ndim;
      local_308[0] = (int)((long)local_314 % GA[lVar3].num_blocks[0]);
      for (local_318 = 1; local_318 < in_stack_fffffffffffffce4; local_318 = local_318 + 1) {
        local_314 = (int)((long)(local_314 - local_308[local_318 + -1]) /
                         GA[lVar3].num_blocks[local_318 + -1]);
        local_308[local_318] = (int)((long)local_314 % GA[lVar3].num_blocks[local_318]);
      }
      for (local_30c = 0; local_30c < sVar1; local_30c = local_30c + 1) {
        local_228[local_30c] = (long)local_308[local_30c] * GA[lVar3].block_dims[local_30c] + 1;
        local_268[local_30c] = (long)(local_308[local_30c] + 1) * GA[lVar3].block_dims[local_30c];
        if (GA[lVar3].dims[local_30c] < local_268[local_30c]) {
          local_268[local_30c] = GA[lVar3].dims[local_30c];
        }
      }
    }
    else if (GA[lVar3].distr_type == 4) {
      in_stack_fffffffffffffcc0 = (int)GA[lVar3].ndim;
      in_stack_fffffffffffffcbc = 0;
      sVar1 = GA[lVar3].ndim;
      in_stack_fffffffffffffcc8 = (undefined4)((long)local_314 % GA[lVar3].num_blocks[0]);
      for (local_34c = 1; local_34c < sVar1; local_34c = local_34c + 1) {
        local_314 = (int)((long)(local_314 -
                                *(int *)(&stack0xfffffffffffffcc8 + (long)(local_34c + -1) * 4)) /
                         GA[lVar3].num_blocks[local_34c + -1]);
        *(int *)(&stack0xfffffffffffffcc8 + (long)local_34c * 4) =
             (int)((long)local_314 % GA[lVar3].num_blocks[local_34c]);
      }
      for (in_stack_fffffffffffffcc4 = 0; in_stack_fffffffffffffcb8 = local_314,
          in_stack_fffffffffffffcc4 < in_stack_fffffffffffffcc0;
          in_stack_fffffffffffffcc4 = in_stack_fffffffffffffcc4 + 1) {
        local_228[in_stack_fffffffffffffcc4] =
             GA[lVar3].mapc
             [in_stack_fffffffffffffcbc +
              *(int *)(&stack0xfffffffffffffcc8 + (long)in_stack_fffffffffffffcc4 * 4)];
        if ((long)*(int *)(&stack0xfffffffffffffcc8 + (long)in_stack_fffffffffffffcc4 * 4) <
            GA[lVar3].num_blocks[in_stack_fffffffffffffcc4] + -1) {
          local_268[in_stack_fffffffffffffcc4] =
               GA[lVar3].mapc
               [in_stack_fffffffffffffcbc +
                *(int *)(&stack0xfffffffffffffcc8 + (long)in_stack_fffffffffffffcc4 * 4) + 1] + -1;
        }
        else {
          local_268[in_stack_fffffffffffffcc4] = GA[lVar3].dims[in_stack_fffffffffffffcc4];
        }
        in_stack_fffffffffffffcbc =
             in_stack_fffffffffffffcbc + (int)GA[lVar3].num_blocks[in_stack_fffffffffffffcc4];
      }
    }
  }
  if (local_1e0 == 0) {
    local_198[0] = (local_268[0] - local_228[0]) + 1 + GA[lVar3].width[0] * 2;
  }
  for (local_1d0 = 0; local_1d0 < local_1e0; local_1d0 = local_1d0 + 1) {
    local_1e8 = alStack_158[local_1d0] * local_1d8 + local_1e8;
    local_198[local_1d0] =
         (local_268[local_1d0] - local_228[local_1d0]) + 1 + GA[lVar3].width[local_1d0] * 2;
    local_1d8 = local_198[local_1d0] * local_1d8;
  }
  local_1e8 = alStack_158[local_1e0] * local_1d8 + local_1e8;
  local_1c0 = GA[lVar3].ptr[local_1c8] + local_1e8 * GA[lVar3].elemsize;
  pnga_nbget(CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),in_stack_fffffffffffffcd8
             ,in_stack_fffffffffffffcd0,
             (void *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (Integer *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (Integer *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  return;
}

Assistant:

void pnga_nbget_ghost_dir(Integer g_a,
                               Integer *mask,
                               Integer *nbhandle)
{
  Integer handle = GA_OFFSET + g_a;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM], lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer subscript[MAXDIM], ld[MAXDIM];
  Integer i, ndim, dim, width;
  char *ptr_loc;
  Integer me = pnga_nodeid();
  /*Integer p_handle;*/
  ndim = GA[handle].ndim;
  /*p_handle = GA[handle].p_handle;*/
  /* check mask to see that it corresponds to a valid direction */
  for (i=0; i<ndim; i++) {
    if (labs(mask[i]) != 0 && labs(mask[i]) != 1)
      pnga_error("nga_nbget_ghost_dir: invalid mask entry", mask[i]);
  }

  /* get range of data on local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* locate data on remote processor */
  for (i=0; i<ndim; i++) {
    dim = (Integer)GA[handle].dims[i];
    width = (Integer)GA[handle].width[i];
    if (mask[i] == 1) {
      if (hi_loc[i] == dim) {
        lo_rem[i] = 1;
        hi_rem[i] = width;
      } else {
        lo_rem[i] = hi_loc[i]+1;
        hi_rem[i] = hi_loc[i]+width;
      }
    } else if (mask[i] == -1) {
      if (lo_loc[i] == 1) {
        lo_rem[i] = dim - width + 1;
        hi_rem[i] = dim;
      } else {
        lo_rem[i] = lo_loc[i] - width;
        hi_rem[i] = lo_loc[i] - 1;
      }
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }
  
  /* Get pointer to data destination on local block. Start by
     by finding subscript to origin of destination block */
  for (i=0; i<ndim; i++) {
    if (mask[i] == 1) {
      subscript[i] = hi_loc[i]-lo_loc[i]+1+GA[handle].width[i];
    } else if (mask[i] == -1) {
      subscript[i] = 0;
    } else {
      subscript[i] = GA[handle].width[i];
    }
    ld[i] = hi_loc[i]-lo_loc[i]+1+2*GA[handle].width[i];
  }
  gam_LocationWithGhosts(me, handle, subscript, &ptr_loc, ld);
  /* get data */
  pnga_nbget(g_a,lo_rem,hi_rem,ptr_loc,ld,nbhandle);  
}